

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::increment
          (segment_index_iterator<std::_List_iterator<wchar_t>_> *this)

{
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  pair<unsigned_long,_unsigned_long> pos;
  pair<unsigned_long,_unsigned_long> pos_00;
  pair<unsigned_long,_unsigned_long> pos_01;
  pair<unsigned_long,_unsigned_long> pos_02;
  
  uVar8 = (this->current_).second;
  if (this->full_select_ == false) {
    peVar2 = (this->map_->index_).
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar3 = (long)(peVar2->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(peVar2->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4;
    if (uVar5 <= uVar8) {
      pos_00.second = uVar8;
      pos_00.first = (this->current_).first;
      update_current(this,pos_00);
      return;
    }
    puVar9 = (uint *)(lVar3 + uVar8 * 0x10 + 0x18);
    do {
      uVar4 = uVar8;
      uVar8 = uVar4 + 1;
      if (uVar5 == uVar8) {
        pos_02.second = uVar5;
        pos_02.first = uVar5 - 1;
        update_current(this,pos_02);
        return;
      }
    } while (((*puVar9 & this->mask_) == 0) && (puVar9 = puVar9 + 4, uVar8 < uVar5));
    pos.second = uVar8;
    pos.first = uVar4;
    update_current(this,pos);
    return;
  }
  peVar2 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4;
  uVar5 = uVar4;
  if (uVar4 < uVar8) {
    uVar5 = uVar8;
  }
  uVar6 = uVar8;
  puVar9 = (uint *)(uVar8 * 0x10 + lVar3 + 0x18);
  do {
    uVar7 = uVar5;
    if ((uVar4 <= uVar6) || (uVar7 = uVar4, uVar4 - 1 == uVar6)) break;
    uVar7 = uVar6 + 1;
    uVar1 = *puVar9;
    uVar6 = uVar7;
    puVar9 = puVar9 + 4;
  } while ((uVar1 & this->mask_) == 0);
  if (uVar7 == uVar4) {
    uVar8 = uVar7 - 1;
  }
  pos_01.second = uVar7;
  pos_01.first = uVar8;
  update_current(this,pos_01);
  return;
}

Assistant:

void increment()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            next.first = next.second;
                            while(next.second < size()) {
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                            if(next.second == size())
                                next.first = next.second - 1;
                        }
                        else {
                            while(next.second < size()) {
                                next.first = next.second;
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                        }
                        update_current(next);
                    }